

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_launch_thread(mk_server *server,pthread_t *tout)

{
  int iVar1;
  undefined8 *__arg;
  mk_sched_thread_conf *thconf;
  pthread_attr_t attr;
  pthread_t tid;
  pthread_t *tout_local;
  mk_server *server_local;
  
  server->pth_init = 0;
  tid = (pthread_t)tout;
  tout_local = (pthread_t *)server;
  pthread_mutex_lock((pthread_mutex_t *)&server->pth_mutex);
  __arg = (undefined8 *)mk_mem_alloc_z(8);
  *__arg = tout_local;
  pthread_attr_init((pthread_attr_t *)&thconf);
  pthread_attr_setdetachstate((pthread_attr_t *)&thconf,0);
  iVar1 = pthread_create((pthread_t *)(attr.__size + 0x30),(pthread_attr_t *)&thconf,
                         mk_sched_launch_worker_loop,__arg);
  if (iVar1 == 0) {
    *(undefined8 *)tid = attr._48_8_;
    while ((int)tout_local[0x4c] == 0) {
      pthread_cond_wait((pthread_cond_t *)(tout_local + 0x4d),(pthread_mutex_t *)(tout_local + 0x53)
                       );
    }
    pthread_mutex_unlock((pthread_mutex_t *)(tout_local + 0x53));
    server_local._4_4_ = 0;
  }
  else {
    mk_utils_libc_error("pthread_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
                        ,0x1bd);
    pthread_mutex_unlock((pthread_mutex_t *)(tout_local + 0x53));
    server_local._4_4_ = -1;
  }
  return server_local._4_4_;
}

Assistant:

int mk_sched_launch_thread(struct mk_server *server, pthread_t *tout)
{
    pthread_t tid;
    pthread_attr_t attr;
    struct mk_sched_thread_conf *thconf;

    server->pth_init = MK_FALSE;

    /*
     * This lock is used for the 'pth_cond' conditional. Once the worker
     * thread is ready it will signal the condition.
     */
    pthread_mutex_lock(&server->pth_mutex);

    /* Thread data */
    thconf = mk_mem_alloc_z(sizeof(struct mk_sched_thread_conf));
    thconf->server = server;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    if (pthread_create(&tid, &attr, mk_sched_launch_worker_loop,
                       (void *) thconf) != 0) {
        mk_libc_error("pthread_create");
        pthread_mutex_unlock(&server->pth_mutex);
        return -1;
    }

    *tout = tid;

    /* Block until the child thread is ready */
    while (!server->pth_init) {
        pthread_cond_wait(&server->pth_cond, &server->pth_mutex);
    }

    pthread_mutex_unlock(&server->pth_mutex);

    return 0;
}